

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode Curl_ossl_set_engine_default(Curl_easy *data)

{
  ENGINE *e;
  int iVar1;
  char *pcVar2;
  CURLcode CVar3;
  
  e = (ENGINE *)(data->state).engine;
  if (e == (ENGINE *)0x0) {
    CVar3 = CURLE_OK;
  }
  else {
    iVar1 = ENGINE_set_default(e,0xffff);
    pcVar2 = ENGINE_get_id((ENGINE *)(data->state).engine);
    if (iVar1 < 1) {
      Curl_failf(data,"set default crypto engine \'%s\' failed",pcVar2);
      CVar3 = CURLE_SSL_ENGINE_SETFAILED;
    }
    else {
      CVar3 = CURLE_OK;
      Curl_infof(data,"set default crypto engine \'%s\'\n",pcVar2);
    }
  }
  return CVar3;
}

Assistant:

static CURLcode Curl_ossl_set_engine_default(struct Curl_easy *data)
{
#ifdef HAVE_OPENSSL_ENGINE_H
  if(data->state.engine) {
    if(ENGINE_set_default(data->state.engine, ENGINE_METHOD_ALL) > 0) {
      infof(data, "set default crypto engine '%s'\n",
            ENGINE_get_id(data->state.engine));
    }
    else {
      failf(data, "set default crypto engine '%s' failed",
            ENGINE_get_id(data->state.engine));
      return CURLE_SSL_ENGINE_SETFAILED;
    }
  }
#else
  (void) data;
#endif
  return CURLE_OK;
}